

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

void __thiscall buffer::~buffer(buffer *this)

{
  if (this->buffer_ != (char *)0x0) {
    free(this->buffer_);
    this->begin_ = (char *)0x0;
    this->end_ = (char *)0x0;
    *(undefined8 *)&this->capacity_ = 0;
    *(undefined8 *)((long)&this->buffer_ + 4) = 0;
  }
  return;
}

Assistant:

buffer::~buffer()
{
    if (buffer_) 
    {
        free(buffer_);
        buffer_ = NULL;
        begin_ = NULL;
        end_ = NULL;
        capacity_ = 0;
    }
}